

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

double __thiscall sector_t::FindLowestCeilingSurrounding(sector_t *this,vertex_t **v)

{
  line_t_conflict *line;
  short sVar1;
  sector_t_conflict *psVar2;
  long lVar3;
  vertex_t *pvVar4;
  double dVar5;
  double dVar6;
  
  sVar1 = this->linecount;
  if (sVar1 == 0) {
    dVar6 = this->planes[1].TexZ;
  }
  else {
    pvVar4 = (*this->lines)->v1;
    dVar6 = 3.4028234663852886e+38;
    for (lVar3 = 0; lVar3 < sVar1; lVar3 = lVar3 + 1) {
      line = this->lines[lVar3];
      psVar2 = getNextSector(line,(sector_t_conflict *)this);
      if (psVar2 != (sector_t_conflict *)0x0) {
        dVar5 = secplane_t::ZatPoint(&psVar2->ceilingplane,line->v1);
        if (dVar5 < dVar6) {
          pvVar4 = line->v1;
          dVar6 = dVar5;
        }
        dVar5 = secplane_t::ZatPoint(&psVar2->ceilingplane,line->v2);
        if (dVar5 < dVar6) {
          pvVar4 = line->v2;
          dVar6 = dVar5;
        }
      }
      sVar1 = this->linecount;
    }
    if (v != (vertex_t **)0x0) {
      *v = pvVar4;
    }
  }
  return dVar6;
}

Assistant:

double sector_t::FindLowestCeilingSurrounding (vertex_t **v) const
{
	double height;
	double oceil;
	sector_t *other;
	vertex_t *spot;
	line_t *check;
	int i;

	if (linecount == 0) return GetPlaneTexZ(sector_t::ceiling);

	spot = lines[0]->v1;
	height = FLT_MAX;

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			oceil = other->ceilingplane.ZatPoint(check->v1);
			if (oceil < height)
			{
				height = oceil;
				spot = check->v1;
			}
			oceil = other->ceilingplane.ZatPoint(check->v2);
			if (oceil < height)
			{
				height = oceil;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}